

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::VerifyLinkItemIsTarget
          (cmGeneratorTarget *this,LinkItemRole role,cmLinkItem *item)

{
  size_t *psVar1;
  cmMakefile *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  string *psVar5;
  long lVar6;
  cmake *this_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string e;
  string local_e8;
  undefined1 local_c8 [24];
  cmMakefile *pcStack_b0;
  _Alloc_hider local_a8;
  pointer local_a0;
  undefined1 local_98 [16];
  ulong local_88;
  char *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  pointer local_60;
  undefined8 local_58;
  char *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (item->Target != (cmGeneratorTarget *)0x0) {
    return true;
  }
  psVar5 = cmLinkItem::AsStr_abi_cxx11_(item);
  if (psVar5->_M_string_length != 0) {
    uVar3 = (byte)*(psVar5->_M_dataplus)._M_p - 0x24;
    if ((uVar3 < 0x3d) && ((0x1000000000000201U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      return true;
    }
    lVar6 = std::__cxx11::string::find_first_of((char *)psVar5,0x6f8874,0);
    if (lVar6 != -1) {
      return true;
    }
    pcStack_b0 = (cmMakefile *)(psVar5->_M_dataplus)._M_p;
    local_c8._16_8_ = psVar5->_M_string_length;
    __str._M_str = "<LINK_LIBRARY:";
    __str._M_len = 0xe;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)(local_c8 + 0x10),0,0xe,
                       __str);
    if (iVar4 == 0) {
      return true;
    }
    pcStack_b0 = (cmMakefile *)(psVar5->_M_dataplus)._M_p;
    local_c8._16_8_ = psVar5->_M_string_length;
    __str_00._M_str = "<LINK_GROUP:";
    __str_00._M_len = 0xc;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)(local_c8 + 0x10),0,0xc,
                       __str_00);
    if (iVar4 == 0) {
      return true;
    }
  }
  psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
  local_a0 = (psVar5->_M_dataplus)._M_p;
  local_a8._M_p = (pointer)psVar5->_M_string_length;
  local_80 = "its link interface contains";
  if (role == Implementation) {
    local_80 = "it links to";
  }
  psVar5 = cmLinkItem::AsStr_abi_cxx11_(item);
  local_c8._16_8_ = (cmLocalGenerator *)0x8;
  pcStack_b0 = (cmMakefile *)0x6dc379;
  local_98._0_8_ = 0x2f;
  local_98._8_8_ = "\" has LINK_LIBRARIES_ONLY_TARGETS enabled, but ";
  local_88 = (ulong)(role != Implementation) << 4 | 0xb;
  local_78 = (_Base_ptr)0x4;
  local_70 = (_Base_ptr)0x712fc7;
  local_60 = (psVar5->_M_dataplus)._M_p;
  local_68 = (_Base_ptr)psVar5->_M_string_length;
  local_58._0_1_ = true;
  local_58._1_7_ = 0;
  local_48 = 0x9d;
  if (_ZN12_GLOBAL__N_128missingTargetPossibleReasonsE_0 == '\0') {
    local_48 = 0;
  }
  local_50 = "\nwhich is not a target.  ";
  local_40._M_allocated_capacity = _ZN12_GLOBAL__N_128missingTargetPossibleReasonsE_1;
  views._M_len = 8;
  views._M_array = (iterator)(local_c8 + 0x10);
  cmCatViews_abi_cxx11_(&local_e8,views);
  local_c8._16_8_ =
       (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  pcStack_b0 = (cmMakefile *)
               (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  if (pcStack_b0 != (cmMakefile *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(pcStack_b0->FindPackageRootPathStack).
                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(pcStack_b0->FindPackageRootPathStack).
                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  bVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_c8 + 0x10));
  if (bVar2) {
    GetBacktrace((cmGeneratorTarget *)local_c8);
    this_00 = pcStack_b0;
    local_c8._16_8_ = local_c8._0_8_;
    pcStack_b0 = (cmMakefile *)local_c8._8_8_;
    if (this_00 != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
  }
  this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
  cmake::IssueMessage(this_01,FATAL_ERROR,&local_e8,(cmListFileBacktrace *)(local_c8 + 0x10));
  if (pcStack_b0 != (cmMakefile *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcStack_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::VerifyLinkItemIsTarget(LinkItemRole role,
                                               cmLinkItem const& item) const
{
  if (item.Target) {
    return true;
  }
  std::string const& str = item.AsStr();
  if (!str.empty() &&
      (str[0] == '-' || str[0] == '$' || str[0] == '`' ||
       str.find_first_of("/\\") != std::string::npos ||
       cmHasPrefix(str, "<LINK_LIBRARY:"_s) ||
       cmHasPrefix(str, "<LINK_GROUP:"_s))) {
    return true;
  }

  std::string e = cmStrCat("Target \"", this->GetName(),
                           "\" has LINK_LIBRARIES_ONLY_TARGETS enabled, but ",
                           role == LinkItemRole::Implementation
                             ? "it links to"
                             : "its link interface contains",
                           ":\n  ", item.AsStr(), "\nwhich is not a target.  ",
                           missingTargetPossibleReasons);
  cmListFileBacktrace backtrace = item.Backtrace;
  if (backtrace.Empty()) {
    backtrace = this->GetBacktrace();
  }
  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e, backtrace);
  return false;
}